

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall ImFont::BuildLookupTable(ImFont *this)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  float *pfVar5;
  unsigned_short *puVar6;
  float fVar7;
  float fVar8;
  ImWchar IVar9;
  undefined2 uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  Glyph *pGVar14;
  Glyph *pGVar15;
  ulong uVar16;
  float *pfVar17;
  char *__function;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  uint uVar23;
  float fVar24;
  
  uVar23 = (this->Glyphs).Size;
  if ((ulong)uVar23 == 0) {
    uVar20 = 1;
  }
  else {
    lVar18 = 0;
    uVar22 = 0;
    if (0 < (int)uVar23) {
      uVar22 = uVar23;
    }
    uVar20 = 0;
    do {
      if (uVar22 <= uVar23 - 1) {
        __function = "value_type &ImVector<ImFont::Glyph>::operator[](int) [T = ImFont::Glyph]";
        goto LAB_00146b5b;
      }
      uVar1 = *(ushort *)((long)&((this->Glyphs).Data)->Codepoint + lVar18);
      if (uVar20 <= uVar1) {
        uVar20 = (uint)uVar1;
      }
      lVar18 = lVar18 + 0x28;
    } while ((ulong)uVar23 * 0x28 != lVar18);
    uVar20 = uVar20 + 1;
  }
  if (0xfffe < (int)uVar23) {
    __assert_fail("Glyphs.Size < 0xFFFF",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui_draw.cpp"
                  ,0x6af,"void ImFont::BuildLookupTable()");
  }
  pfVar5 = (this->IndexXAdvance).Data;
  if (pfVar5 != (float *)0x0) {
    (this->IndexXAdvance).Size = 0;
    (this->IndexXAdvance).Capacity = 0;
    ImGui::MemFree(pfVar5);
    (this->IndexXAdvance).Data = (float *)0x0;
  }
  puVar6 = (this->IndexLookup).Data;
  if (puVar6 != (unsigned_short *)0x0) {
    (this->IndexLookup).Size = 0;
    (this->IndexLookup).Capacity = 0;
    ImGui::MemFree(puVar6);
    (this->IndexLookup).Data = (unsigned_short *)0x0;
  }
  GrowIndex(this,uVar20);
  iVar2 = (this->Glyphs).Size;
  lVar18 = (long)iVar2;
  if (0 < lVar18) {
    iVar3 = (this->IndexXAdvance).Size;
    pfVar5 = (this->IndexXAdvance).Data;
    iVar4 = (this->IndexLookup).Size;
    puVar6 = (this->IndexLookup).Data;
    pfVar17 = &((this->Glyphs).Data)->XAdvance;
    lVar21 = 0;
    do {
      if (iVar3 <= (int)(uint)((Glyph *)(pfVar17 + -1))->Codepoint) goto LAB_00146b18;
      uVar23 = (uint)((Glyph *)(pfVar17 + -1))->Codepoint;
      pfVar5[uVar23] = *pfVar17;
      if (iVar4 <= (int)uVar23) goto LAB_00146b2f;
      puVar6[uVar23] = (unsigned_short)lVar21;
      lVar21 = lVar21 + 1;
      pfVar17 = pfVar17 + 10;
    } while (lVar18 != lVar21);
  }
  if (((this->IndexLookup).Size < 0x21) || (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)
     ) {
    pGVar15 = this->FallbackGlyph;
  }
  else {
    pGVar15 = (Glyph *)((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar1 * 0x28));
  }
  if (pGVar15 == (Glyph *)0x0) {
LAB_00146a99:
    this->FallbackGlyph = (Glyph *)0x0;
    if (((int)(uint)this->FallbackChar < (this->IndexLookup).Size) &&
       (uVar1 = (this->IndexLookup).Data[this->FallbackChar], uVar1 != 0xffff)) {
      pGVar15 = (Glyph *)((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar1 * 0x28));
    }
    else {
      pGVar15 = (Glyph *)0x0;
    }
    this->FallbackGlyph = pGVar15;
    fVar24 = 0.0;
    if (pGVar15 != (Glyph *)0x0) {
      fVar24 = pGVar15->XAdvance;
    }
    this->FallbackXAdvance = fVar24;
    uVar23 = (this->IndexXAdvance).Size;
    pfVar5 = (this->IndexXAdvance).Data;
    uVar19 = 0;
    uVar16 = (ulong)uVar23;
    if ((int)uVar23 < 1) {
      uVar16 = uVar19;
    }
    while (uVar16 != uVar19) {
      pfVar17 = pfVar5 + uVar19;
      if (*pfVar17 <= 0.0 && *pfVar17 != 0.0) {
        pfVar5[uVar19] = this->FallbackXAdvance;
      }
      uVar19 = uVar19 + 1;
      if (uVar20 == uVar19) {
        return;
      }
    }
  }
  else {
    if (iVar2 < 1) {
LAB_00146b65:
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                    ,0x365,"value_type &ImVector<ImFont::Glyph>::back() [T = ImFont::Glyph]");
    }
    if ((this->Glyphs).Data[lVar18 + -1].Codepoint != 9) {
      uVar23 = iVar2 + 1;
      iVar3 = (this->Glyphs).Capacity;
      if (iVar3 <= iVar2) {
        if (iVar3 == 0) {
          uVar22 = 8;
        }
        else {
          uVar22 = iVar3 / 2 + iVar3;
        }
        if ((int)uVar22 <= (int)uVar23) {
          uVar22 = uVar23;
        }
        if (iVar3 < (int)uVar22) {
          pGVar14 = (Glyph *)ImGui::MemAlloc((ulong)uVar22 * 0x28);
          pGVar15 = (this->Glyphs).Data;
          if (pGVar15 != (Glyph *)0x0) {
            memcpy(pGVar14,pGVar15,(long)(this->Glyphs).Size * 0x28);
          }
          ImGui::MemFree((this->Glyphs).Data);
          (this->Glyphs).Data = pGVar14;
          (this->Glyphs).Capacity = uVar22;
        }
      }
      (this->Glyphs).Size = uVar23;
    }
    lVar18 = (long)(this->Glyphs).Size;
    if (lVar18 < 1) goto LAB_00146b65;
    pGVar15 = (this->Glyphs).Data;
    if (((this->IndexLookup).Size < 0x21) ||
       (uVar1 = (this->IndexLookup).Data[0x20], uVar1 == 0xffff)) {
      pGVar14 = this->FallbackGlyph;
    }
    else {
      pGVar14 = (Glyph *)((long)&((this->Glyphs).Data)->Codepoint + (ulong)((uint)uVar1 * 0x28));
    }
    fVar24 = pGVar14->V1;
    pGVar15[lVar18 + -1].U1 = pGVar14->U1;
    pGVar15[lVar18 + -1].V1 = fVar24;
    IVar9 = pGVar14->Codepoint;
    uVar10 = *(undefined2 *)&pGVar14->field_0x2;
    fVar11 = pGVar14->XAdvance;
    fVar12 = pGVar14->X0;
    fVar13 = pGVar14->Y0;
    fVar24 = pGVar14->Y1;
    fVar7 = pGVar14->U0;
    fVar8 = pGVar14->V0;
    pGVar15[lVar18 + -1].X1 = pGVar14->X1;
    pGVar15[lVar18 + -1].Y1 = fVar24;
    pGVar15[lVar18 + -1].U0 = fVar7;
    pGVar15[lVar18 + -1].V0 = fVar8;
    pGVar14 = pGVar15 + lVar18 + -1;
    pGVar14->Codepoint = IVar9;
    *(undefined2 *)&pGVar14->field_0x2 = uVar10;
    pGVar14->XAdvance = fVar11;
    pGVar15[lVar18 + -1].X0 = fVar12;
    pGVar15[lVar18 + -1].Y0 = fVar13;
    pGVar15[lVar18 + -1].Codepoint = 9;
    fVar24 = pGVar15[lVar18 + -1].XAdvance * 4.0;
    pGVar15[lVar18 + -1].XAdvance = fVar24;
    if (9 < (this->IndexXAdvance).Size) {
      (this->IndexXAdvance).Data[9] = fVar24;
      if ((this->IndexLookup).Size < 10) {
LAB_00146b2f:
        __function = "value_type &ImVector<unsigned short>::operator[](int) [T = unsigned short]";
        goto LAB_00146b5b;
      }
      (this->IndexLookup).Data[9] = (short)(this->Glyphs).Size - 1;
      goto LAB_00146a99;
    }
  }
LAB_00146b18:
  __function = "value_type &ImVector<float>::operator[](int) [T = float]";
LAB_00146b5b:
  __assert_fail("i < Size",
                "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/imgui.h"
                ,0x35b,__function);
}

Assistant:

void ImFont::BuildLookupTable()
{
    int max_codepoint = 0;
    for (int i = 0; i != Glyphs.Size; i++)
        max_codepoint = ImMax(max_codepoint, (int)Glyphs[i].Codepoint);

    IM_ASSERT(Glyphs.Size < 0xFFFF); // -1 is reserved
    IndexXAdvance.clear();
    IndexLookup.clear();
    GrowIndex(max_codepoint + 1);
    for (int i = 0; i < Glyphs.Size; i++)
    {
        int codepoint = (int)Glyphs[i].Codepoint;
        IndexXAdvance[codepoint] = Glyphs[i].XAdvance;
        IndexLookup[codepoint] = (unsigned short)i;
    }

    // Create a glyph to handle TAB
    // FIXME: Needs proper TAB handling but it needs to be contextualized (or we could arbitrary say that each string starts at "column 0" ?)
    if (FindGlyph((unsigned short)' '))
    {
        if (Glyphs.back().Codepoint != '\t')   // So we can call this function multiple times
            Glyphs.resize(Glyphs.Size + 1);
        ImFont::Glyph& tab_glyph = Glyphs.back();
        tab_glyph = *FindGlyph((unsigned short)' ');
        tab_glyph.Codepoint = '\t';
        tab_glyph.XAdvance *= 4;
        IndexXAdvance[(int)tab_glyph.Codepoint] = (float)tab_glyph.XAdvance;
        IndexLookup[(int)tab_glyph.Codepoint] = (unsigned short)(Glyphs.Size-1);
    }

    FallbackGlyph = NULL;
    FallbackGlyph = FindGlyph(FallbackChar);
    FallbackXAdvance = FallbackGlyph ? FallbackGlyph->XAdvance : 0.0f;
    for (int i = 0; i < max_codepoint + 1; i++)
        if (IndexXAdvance[i] < 0.0f)
            IndexXAdvance[i] = FallbackXAdvance;
}